

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipedFootContactClassifier.cpp
# Opt level: O0

void __thiscall
iDynTree::BipedFootContactClassifier::detectFeetTransition(BipedFootContactClassifier *this)

{
  int iVar1;
  contactTransition cVar2;
  contactTransition cVar3;
  pointer pCVar4;
  unique_ptr<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
  *in_RDI;
  contactTransition rightFootTransition;
  contactTransition leftFootTransition;
  
  pCVar4 = std::
           unique_ptr<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
           ::get(in_RDI);
  cVar2 = ContactStateMachine::contactTransitionMode(pCVar4);
  pCVar4 = std::
           unique_ptr<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
           ::get(in_RDI);
  cVar3 = ContactStateMachine::contactTransitionMode(pCVar4);
  iVar1 = *(int *)&in_RDI[3]._M_t.
                   super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
                   .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl;
  if (iVar1 == 0) {
    if (*(int *)&in_RDI[2]._M_t.
                 super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
                 .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl == 0) {
      if ((cVar3 == CONTACT_MAKE) &&
         (((ulong)in_RDI[2]._M_t.
                  super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
                  .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl &
          0x100000000) == 0x100000000)) {
        *(undefined4 *)
         &in_RDI[2]._M_t.
          super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
          ._M_t.
          super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
          .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl = 1;
      }
      else if ((cVar2 == STABLE_ONCONTACT) || (cVar3 == STABLE_ONCONTACT)) {
        *(undefined4 *)
         &in_RDI[2]._M_t.
          super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
          ._M_t.
          super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
          .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl = 0;
      }
      else if ((cVar2 == STABLE_OFFCONTACT) &&
              (*(undefined4 *)
                &in_RDI[2]._M_t.
                 super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
                 .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl = 1,
              cVar3 == STABLE_OFFCONTACT)) {
        *(undefined4 *)
         &in_RDI[2]._M_t.
          super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
          ._M_t.
          super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
          .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl = 2;
      }
    }
    else if (*(int *)&in_RDI[2]._M_t.
                      super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
                      .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl ==
             1) {
      if ((cVar2 == CONTACT_MAKE) &&
         (((ulong)in_RDI[2]._M_t.
                  super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
                  .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl &
          0x10000000000) == 0x10000000000)) {
        *(undefined4 *)
         &in_RDI[2]._M_t.
          super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
          ._M_t.
          super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
          .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl = 0;
      }
      else if ((cVar3 == STABLE_ONCONTACT) || (cVar2 == STABLE_ONCONTACT)) {
        *(undefined4 *)
         &in_RDI[2]._M_t.
          super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
          ._M_t.
          super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
          .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl = 1;
      }
      else if ((cVar3 == STABLE_OFFCONTACT) &&
              (*(undefined4 *)
                &in_RDI[2]._M_t.
                 super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
                 .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl = 0,
              cVar2 == STABLE_OFFCONTACT)) {
        *(undefined4 *)
         &in_RDI[2]._M_t.
          super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
          ._M_t.
          super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
          .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl = 2;
      }
    }
    else if (*(int *)&in_RDI[2]._M_t.
                      super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
                      .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl ==
             2) {
      if ((cVar2 == CONTACT_MAKE) || (cVar2 == STABLE_ONCONTACT)) {
        *(undefined4 *)
         &in_RDI[2]._M_t.
          super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
          ._M_t.
          super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
          .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl = 0;
      }
      else if ((cVar3 == CONTACT_MAKE) || (cVar3 == STABLE_ONCONTACT)) {
        *(undefined4 *)
         &in_RDI[2]._M_t.
          super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
          ._M_t.
          super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
          .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl = 1;
      }
    }
  }
  else if (iVar1 == 1) {
    *(undefined4 *)
     &in_RDI[2]._M_t.
      super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
      ._M_t.
      super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
      .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl = 0;
  }
  else if (iVar1 == 2) {
    *(undefined4 *)
     &in_RDI[2]._M_t.
      super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
      ._M_t.
      super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
      .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl = 0;
  }
  return;
}

Assistant:

void BipedFootContactClassifier::detectFeetTransition()
{
    ContactStateMachine::contactTransition leftFootTransition = m_leftFootContactClassifier.get()->contactTransitionMode();
    ContactStateMachine::contactTransition rightFootTransition = m_rightFootContactClassifier.get()->contactTransitionMode();
    
    switch (m_pattern)
    {
        case SwitchingPattern::ALTERNATE_CONTACT:
            if (m_primaryFoot == LEFT_FOOT)
            {                
                if ( rightFootTransition == ContactStateMachine::CONTACT_MAKE && m_leftFootContactState == true)
                {
                    m_primaryFoot = RIGHT_FOOT; 
                }
                else if (leftFootTransition == ContactStateMachine::STABLE_ONCONTACT || rightFootTransition == ContactStateMachine::STABLE_ONCONTACT)
                {
                    m_primaryFoot = LEFT_FOOT;
                }
                else if (leftFootTransition == ContactStateMachine::STABLE_OFFCONTACT)
                {
                    m_primaryFoot = RIGHT_FOOT;
                    if (rightFootTransition == ContactStateMachine::STABLE_OFFCONTACT)
                    {
                        m_primaryFoot = UNKNOWN_FOOT;
                    }
                }
            }
            else if (m_primaryFoot == RIGHT_FOOT)
            {                
                if ( leftFootTransition == ContactStateMachine::CONTACT_MAKE && m_rightFootContactState == true)
                {
                    m_primaryFoot = LEFT_FOOT;
                }
                
                else if (rightFootTransition == ContactStateMachine::STABLE_ONCONTACT || leftFootTransition == ContactStateMachine::STABLE_ONCONTACT)
                {
                    m_primaryFoot = RIGHT_FOOT;
                }
                
                else if (rightFootTransition == ContactStateMachine::STABLE_OFFCONTACT)
                {
                    m_primaryFoot = LEFT_FOOT;
                    if (leftFootTransition == ContactStateMachine::STABLE_OFFCONTACT)
                    {
                        m_primaryFoot = UNKNOWN_FOOT;
                    }
                }
            }
            else if (m_primaryFoot == UNKNOWN_FOOT)
            {
                // check if left foot has become active first, then check right foot
                if (leftFootTransition == ContactStateMachine::CONTACT_MAKE || leftFootTransition == ContactStateMachine::STABLE_ONCONTACT)
                {
                    m_primaryFoot = LEFT_FOOT;
                }
                else if (rightFootTransition == ContactStateMachine::CONTACT_MAKE || rightFootTransition == ContactStateMachine::STABLE_ONCONTACT)
                {
                    m_primaryFoot = RIGHT_FOOT;
                }
            }
            break;
            
        case SwitchingPattern::LATEST_ACTIVE_CONTACT:
            m_primaryFoot = LEFT_FOOT;
            break;
            
        case SwitchingPattern::DEFAULT_CONTACT:
            m_primaryFoot = LEFT_FOOT;
            break;
    }
}